

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiSwapChainHdrInfo *info)

{
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  QRhiSwapChainHdrInfo *this;
  int *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)info);
  *(undefined1 *)(*(long *)info + 0x30) = 0;
  QDebug::operator<<((QDebug *)info,"QRhiSwapChainHdrInfo(");
  if (*in_RDX == 1) {
    *(undefined1 *)(*(long *)info + 0x30) = 0;
    pQVar3 = QDebug::operator<<((QDebug *)info," maxColorComponentValue=");
    QDebug::operator<<(pQVar3,(float)in_RDX[1]);
    *(undefined1 *)(*(long *)info + 0x30) = 0;
    t = " maxPotentialColorComponentValue=";
    this = info;
  }
  else {
    if (*in_RDX != 0) goto LAB_003ed034;
    *(undefined1 *)(*(long *)info + 0x30) = 0;
    pQVar3 = QDebug::operator<<((QDebug *)info," minLuminance=");
    this = (QRhiSwapChainHdrInfo *)QDebug::operator<<(pQVar3,(float)in_RDX[1]);
    t = " maxLuminance=";
  }
  pQVar3 = QDebug::operator<<((QDebug *)this,t);
  QDebug::operator<<(pQVar3,(float)in_RDX[2]);
LAB_003ed034:
  if (in_RDX[3] == 1) {
    *(undefined1 *)(*(long *)info + 0x30) = 0;
    QDebug::operator<<((QDebug *)info," display-referred");
  }
  else if (in_RDX[3] == 0) {
    *(undefined1 *)(*(long *)info + 0x30) = 0;
    pQVar3 = QDebug::operator<<((QDebug *)info," scene-referred, SDR white level=");
    QDebug::operator<<(pQVar3,(float)in_RDX[4]);
  }
  *(undefined1 *)(*(long *)info + 0x30) = 0;
  QDebug::operator<<((QDebug *)info,')');
  uVar2 = *(undefined8 *)info;
  *(undefined8 *)info = 0;
  *(undefined8 *)dbg.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiSwapChainHdrInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiSwapChainHdrInfo(";
    switch (info.limitsType) {
    case QRhiSwapChainHdrInfo::LuminanceInNits:
        dbg.nospace() << " minLuminance=" << info.limits.luminanceInNits.minLuminance
                      << " maxLuminance=" << info.limits.luminanceInNits.maxLuminance;
        break;
    case QRhiSwapChainHdrInfo::ColorComponentValue:
        dbg.nospace() << " maxColorComponentValue=" << info.limits.colorComponentValue.maxColorComponentValue;
        dbg.nospace() << " maxPotentialColorComponentValue=" << info.limits.colorComponentValue.maxPotentialColorComponentValue;
        break;
    }
    switch (info.luminanceBehavior) {
    case QRhiSwapChainHdrInfo::SceneReferred:
        dbg.nospace() << " scene-referred, SDR white level=" << info.sdrWhiteLevel;
        break;
    case QRhiSwapChainHdrInfo::DisplayReferred:
        dbg.nospace() << " display-referred";
        break;
    }
    dbg.nospace() << ')';
    return dbg;
}